

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::Param_Types::push_front(Param_Types *this,string *t_name,Type_Info t_ti)

{
  pointer ppVar1;
  pointer ppVar2;
  size_type sVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  *__range2;
  bool bVar4;
  
  std::
  vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
  ::_M_emplace_aux<std::__cxx11::string,chaiscript::Type_Info&>
            ((vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
              *)this,(this->m_types).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,t_name,&t_ti);
  ppVar1 = (this->m_types).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->m_types).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppVar1 == ppVar2;
  if (!bVar4) {
    sVar3 = (ppVar1->first)._M_string_length;
    while (sVar3 == 0) {
      bVar4 = ppVar1 + 1 == ppVar2;
      if (bVar4) goto LAB_003459f5;
      sVar3 = ppVar1[1].first._M_string_length;
      ppVar1 = ppVar1 + 1;
    }
    this->m_has_types = true;
    if (!bVar4) {
      return;
    }
  }
LAB_003459f5:
  this->m_has_types = false;
  return;
}

Assistant:

void push_front(std::string t_name, Type_Info t_ti) {
        m_types.emplace(m_types.begin(), std::move(t_name), t_ti);
        update_has_types();
      }